

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_arguments_Test::TestBody(preprocessor_test_arguments_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t second_remove [3];
  size_t first_remove [3];
  unsigned_long *in_stack_fffffffffffffc00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  AssertionResult *this_01;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_280;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_258;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_230;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_208;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined8 local_188;
  undefined8 local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined8 local_158;
  undefined8 local_150;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_128;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined8 local_100;
  undefined8 local_f8;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  AssertionResult local_c0;
  AssertHelper local_b0;
  Message local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  AssertionResult local_90;
  AssertHelper local_80;
  Message local_78 [3];
  undefined4 local_60;
  undefined4 local_5c;
  AssertionResult local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 2;
  uStack_20 = 3;
  local_18 = 4;
  local_48 = 1;
  uStack_40 = 3;
  local_38 = 4;
  local_5c = 1;
  local_60 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ecb7);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message((Message *)0x10ed1a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ed72);
  local_98 = local_28;
  local_a0 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ee30);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message((Message *)0x10ee93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eeeb);
  local_c8 = uStack_20;
  local_d0 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10efa9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x10f00c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f064);
  local_f8 = local_18;
  local_100 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f122);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x10f185);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f1da);
  local_124 = 2;
  local_128 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f28e);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x10f2f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f349);
  local_150 = local_48;
  local_158 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f407);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x10f46a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f4c2);
  local_180 = uStack_40;
  local_188 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f580);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message((Message *)0x10f5e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f63b);
  local_1b0 = local_38;
  local_1b8 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f6f9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message((Message *)0x10f75c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f7b1);
  local_1dc = 0;
  local_1e0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f865);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x10f8c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f917);
  local_204 = 1;
  local_208 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10f9bf);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message((Message *)0x10fa1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fa71);
  local_22c = 2;
  local_230 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10fb19);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message((Message *)0x10fb76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fbcb);
  local_254 = 3;
  local_258 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10fc73);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message((Message *)0x10fcd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fd25);
  local_27c = 4;
  local_280 = 4;
  this_01 = &local_278;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    in_stack_fffffffffffffc10 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10fdcd);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x47,in_stack_fffffffffffffc10);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x10fe2a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fe7f);
  local_2a4 = 0;
  local_2a8 = 0;
  this_00 = &local_2a0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffc10,
             (int *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ff27);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x10ff82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ffd7);
  return;
}

Assistant:

TEST_F(preprocessor_test, arguments)
{
	size_t first_remove[] = { PREPROCESSOR_ARGS_FIRST_REMOVE(1, 2, 3, 4) };

	size_t second_remove[] = { PREPROCESSOR_ARGS_SECOND_REMOVE(1, 2, 3, 4) };

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_FIRST(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)first_remove[0], (size_t)2);

	EXPECT_EQ((size_t)first_remove[1], (size_t)3);

	EXPECT_EQ((size_t)first_remove[2], (size_t)4);

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_SECOND(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)second_remove[0], (size_t)1);

	EXPECT_EQ((size_t)second_remove[1], (size_t)3);

	EXPECT_EQ((size_t)second_remove[2], (size_t)4);

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT());

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_COUNT(a));

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_COUNT(a, b));

	EXPECT_EQ((int)3, (int)PREPROCESSOR_ARGS_COUNT(a, b, c));

	EXPECT_EQ((int)4, (int)PREPROCESSOR_ARGS_COUNT(a, b, c, d));

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT(/* ... */));
}